

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmInfo.cpp
# Opt level: O2

void __thiscall
GmmLib::GmmMultiAdapterContext::RemoveAdapterNode
          (GmmMultiAdapterContext *this,GMM_ADAPTER_INFO *pNode)

{
  GMM_ADAPTER_INFO **ppGVar1;
  GMM_ADAPTER_INFO *pGVar2;
  GMM_ADAPTER_INFO *pGVar3;
  _GMM_ADAPTER_INFO_ **pp_Var4;
  
  ppGVar1 = &this->pHeadNode;
  pGVar2 = (GMM_ADAPTER_INFO *)0x0;
  pp_Var4 = ppGVar1;
  do {
    pGVar3 = pGVar2;
    pGVar2 = *pp_Var4;
    if (pGVar2 == (GMM_ADAPTER_INFO *)0x0) {
      return;
    }
    pp_Var4 = &pGVar2->pNext;
  } while (pGVar2 != pNode);
  if (pGVar3 == (GMM_ADAPTER_INFO *)0x0) {
    if (*ppGVar1 == pNode) {
      *ppGVar1 = pNode->pNext;
    }
  }
  else {
    pGVar3->pNext = pNode->pNext;
  }
  this->NumAdapters = this->NumAdapters - 1;
  free(pNode);
  return;
}

Assistant:

void GmmLib::GmmMultiAdapterContext::RemoveAdapterNode(GMM_ADAPTER_INFO *pNode)
{
    GMM_ADAPTER_INFO *pCur = NULL, *pPrev = NULL;

    // Find the node and remove the node from the list
    pCur = this->pHeadNode;
    while (pCur)
    {
        if (pCur == pNode)
        {
            if (pPrev)
            {
                // the node to be removed is in the middle of the list or the tail
                pPrev->pNext = pNode->pNext;
            }
            else if (pNode == this->pHeadNode)
            {
                // the node to be removed is the head of the list
                this->pHeadNode = pNode->pNext;
            }

            // Decrement the Adapter Node count tracker variable
            this->NumAdapters--;

            // Free the node that was removed from the list above.
            free(pNode);
            break;
        }
        pPrev = pCur;
        pCur  = pCur->pNext;
    }
    GMM_ASSERTDPF(pCur != NULL, "CRITICAL ERROR: Node to be released does not exist in list");
}